

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AIS.h
# Opt level: O0

int decode_AIS(char *aisbuf,int aisbuflen,double *pAIS_Latitude,double *pAIS_Longitude,
              double *pAIS_SOG,double *pAIS_COG)

{
  char cVar1;
  _Setfill<char> _Var2;
  int iVar3;
  int iVar4;
  _Setw _Var5;
  ulong uVar6;
  char *pcVar7;
  unsigned_long uVar8;
  ostream *poVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  string *local_1450;
  string *local_1298;
  string local_1288;
  int local_1264;
  string local_1260 [4];
  int ais_true_heading;
  string local_1240;
  int local_121c;
  string local_1218 [4];
  int ais_course_over_ground;
  double local_11f8;
  double ais_latitude;
  bitset<27UL> ii;
  double dStack_11c0;
  char south;
  double ais_longitude;
  bitset<28UL> hh;
  string local_1188 [7];
  char west;
  string ais_position_accuracy;
  string local_1140 [4];
  int ais_speed_over_ground;
  string local_1120;
  int local_10fc;
  string local_10f8 [4];
  int ais_rate_of_turn;
  string local_10d8;
  int local_10b4;
  string local_10b0 [4];
  int ais_navigation_status;
  string local_1090;
  int local_106c;
  string local_1068 [4];
  int ais_mmsi;
  string local_1048;
  int local_1024;
  string local_1020 [4];
  int ais_repeat_indicator;
  undefined4 local_ffc;
  string local_ff8;
  int local_fd4;
  undefined1 local_fd0 [4];
  int ais_message_type;
  string temp_s;
  int y;
  int z;
  uint x;
  string ais_binary;
  string local_f78 [8];
  string six_bit;
  string local_f48 [8];
  string six_bit_table [120];
  double *pAIS_COG_local;
  double *pAIS_SOG_local;
  double *pAIS_Longitude_local;
  double *pAIS_Latitude_local;
  int aisbuflen_local;
  char *aisbuf_local;
  
  local_1298 = local_f48;
  do {
    std::__cxx11::string::string(local_1298);
    local_1298 = local_1298 + 0x20;
  } while (local_1298 != (string *)((long)&six_bit_table[0x77].field_2 + 8));
  std::__cxx11::string::operator=((string *)(six_bit_table[0x2f].field_2._M_local_buf + 8),"000000")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x30].field_2._M_local_buf + 8),"000001")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x31].field_2._M_local_buf + 8),"000010")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x32].field_2._M_local_buf + 8),"000011")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x33].field_2._M_local_buf + 8),"000100")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x34].field_2._M_local_buf + 8),"000101")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x35].field_2._M_local_buf + 8),"000110")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x36].field_2._M_local_buf + 8),"000111")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x37].field_2._M_local_buf + 8),"001000")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x38].field_2._M_local_buf + 8),"001001")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x39].field_2._M_local_buf + 8),"001010")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x3a].field_2._M_local_buf + 8),"001011")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x3b].field_2._M_local_buf + 8),"001100")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x3c].field_2._M_local_buf + 8),"001101")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x3d].field_2._M_local_buf + 8),"001110")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x3e].field_2._M_local_buf + 8),"001111")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x3f].field_2._M_local_buf + 8),"010000")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x40].field_2._M_local_buf + 8),"010001")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x41].field_2._M_local_buf + 8),"010010")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x42].field_2._M_local_buf + 8),"010011")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x43].field_2._M_local_buf + 8),"010100")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x44].field_2._M_local_buf + 8),"010101")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x45].field_2._M_local_buf + 8),"010110")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x46].field_2._M_local_buf + 8),"010111")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x47].field_2._M_local_buf + 8),"011000")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x48].field_2._M_local_buf + 8),"011001")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x49].field_2._M_local_buf + 8),"011010")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x4a].field_2._M_local_buf + 8),"011011")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x4b].field_2._M_local_buf + 8),"011100")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x4c].field_2._M_local_buf + 8),"011101")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x4d].field_2._M_local_buf + 8),"011110")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x4e].field_2._M_local_buf + 8),"011111")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x4f].field_2._M_local_buf + 8),"100000")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x50].field_2._M_local_buf + 8),"100001")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x51].field_2._M_local_buf + 8),"100010")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x52].field_2._M_local_buf + 8),"100011")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x53].field_2._M_local_buf + 8),"100100")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x54].field_2._M_local_buf + 8),"100101")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x55].field_2._M_local_buf + 8),"100110")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x56].field_2._M_local_buf + 8),"100111")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x5f].field_2._M_local_buf + 8),"101000")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x60].field_2._M_local_buf + 8),"101001")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x61].field_2._M_local_buf + 8),"101010")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x62].field_2._M_local_buf + 8),"101011")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[99].field_2._M_local_buf + 8),"101100");
  std::__cxx11::string::operator=((string *)(six_bit_table[100].field_2._M_local_buf + 8),"101101");
  std::__cxx11::string::operator=((string *)(six_bit_table[0x65].field_2._M_local_buf + 8),"101110")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x66].field_2._M_local_buf + 8),"101111")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x67].field_2._M_local_buf + 8),"110000")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x68].field_2._M_local_buf + 8),"110001")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x69].field_2._M_local_buf + 8),"110010")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x6a].field_2._M_local_buf + 8),"110011")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x6b].field_2._M_local_buf + 8),"110100")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x6c].field_2._M_local_buf + 8),"110101")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x6d].field_2._M_local_buf + 8),"110110")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x6e].field_2._M_local_buf + 8),"110111")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x6f].field_2._M_local_buf + 8),"111000")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x70].field_2._M_local_buf + 8),"111001")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x71].field_2._M_local_buf + 8),"111010")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x72].field_2._M_local_buf + 8),"111011")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x73].field_2._M_local_buf + 8),"111100")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x74].field_2._M_local_buf + 8),"111101")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x75].field_2._M_local_buf + 8),"111110")
  ;
  std::__cxx11::string::operator=((string *)(six_bit_table[0x76].field_2._M_local_buf + 8),"111111")
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_f78,aisbuf,(allocator<char> *)(ais_binary.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(ais_binary.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&x,"",(allocator<char> *)((long)&z + 3));
  std::allocator<char>::~allocator((allocator<char> *)((long)&z + 3));
  y = 0;
  while( true ) {
    uVar6 = std::__cxx11::string::length();
    if (uVar6 <= (uint)y) break;
    pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_f78);
    temp_s.field_2._12_4_ = SEXT14(*pcVar7);
    temp_s.field_2._8_4_ = y * 6 + 1;
    std::__cxx11::string::append((string *)&x);
    y = y + 1;
  }
  std::__cxx11::string::substr((ulong)local_fd0,(ulong)&x);
  std::__cxx11::string::string((string *)&local_ff8,(string *)local_fd0);
  iVar3 = bin_to_int_AIS(&local_ff8);
  std::__cxx11::string::~string((string *)&local_ff8);
  local_fd4 = iVar3;
  if ((iVar3 < 1) || (3 < iVar3)) {
    aisbuf_local._4_4_ = 1;
    local_ffc = 1;
  }
  else {
    std::__cxx11::string::substr((ulong)local_1020,(ulong)&x);
    std::__cxx11::string::operator=((string *)local_fd0,local_1020);
    std::__cxx11::string::~string(local_1020);
    std::__cxx11::string::string((string *)&local_1048,(string *)local_fd0);
    iVar3 = bin_to_int_AIS(&local_1048);
    std::__cxx11::string::~string((string *)&local_1048);
    local_1024 = iVar3;
    std::__cxx11::string::substr((ulong)local_1068,(ulong)&x);
    std::__cxx11::string::operator=((string *)local_fd0,local_1068);
    std::__cxx11::string::~string(local_1068);
    std::__cxx11::string::string((string *)&local_1090,(string *)local_fd0);
    iVar3 = bin_to_int_AIS(&local_1090);
    std::__cxx11::string::~string((string *)&local_1090);
    local_106c = iVar3;
    std::__cxx11::string::substr((ulong)local_10b0,(ulong)&x);
    std::__cxx11::string::operator=((string *)local_fd0,local_10b0);
    std::__cxx11::string::~string(local_10b0);
    std::__cxx11::string::string((string *)&local_10d8,(string *)local_fd0);
    iVar3 = bin_to_int_AIS(&local_10d8);
    std::__cxx11::string::~string((string *)&local_10d8);
    local_10b4 = iVar3;
    std::__cxx11::string::substr((ulong)local_10f8,(ulong)&x);
    std::__cxx11::string::operator=((string *)local_fd0,local_10f8);
    std::__cxx11::string::~string(local_10f8);
    std::__cxx11::string::string((string *)&local_1120,(string *)local_fd0);
    iVar3 = bin_to_int_AIS(&local_1120);
    std::__cxx11::string::~string((string *)&local_1120);
    local_10fc = iVar3;
    std::__cxx11::string::substr((ulong)local_1140,(ulong)&x);
    std::__cxx11::string::operator=((string *)local_fd0,local_1140);
    std::__cxx11::string::~string(local_1140);
    std::__cxx11::string::string
              ((string *)(ais_position_accuracy.field_2._M_local_buf + 8),(string *)local_fd0);
    iVar3 = bin_to_int_AIS((string *)((long)&ais_position_accuracy.field_2 + 8));
    std::__cxx11::string::~string((string *)(ais_position_accuracy.field_2._M_local_buf + 8));
    std::__cxx11::string::substr((ulong)local_1188,(ulong)&x);
    pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)&x);
    cVar1 = *pcVar7;
    std::__cxx11::string::substr((ulong)&hh,(ulong)&x);
    std::__cxx11::string::operator=((string *)local_fd0,(string *)&hh);
    std::__cxx11::string::~string((string *)&hh);
    std::bitset<28ul>::bitset<char,std::char_traits<char>,std::allocator<char>>
              ((bitset<28ul> *)&ais_longitude,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_fd0,0);
    if (cVar1 == '1') {
      std::bitset<28UL>::flip((bitset<28UL> *)&ais_longitude);
    }
    uVar8 = std::bitset<28UL>::to_ulong((bitset<28UL> *)&ais_longitude);
    auVar10._8_4_ = (int)(uVar8 >> 0x20);
    auVar10._0_8_ = uVar8;
    auVar10._12_4_ = 0x45300000;
    dStack_11c0 = (((auVar10._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0)) / 10000.0) / 60.0
    ;
    if (cVar1 == '1') {
      dStack_11c0 = dStack_11c0 * -1.0;
    }
    pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)&x);
    cVar1 = *pcVar7;
    std::__cxx11::string::substr((ulong)&ii,(ulong)&x);
    std::__cxx11::string::operator=((string *)local_fd0,(string *)&ii);
    std::__cxx11::string::~string((string *)&ii);
    std::bitset<27ul>::bitset<char,std::char_traits<char>,std::allocator<char>>
              ((bitset<27ul> *)&ais_latitude,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_fd0,0);
    if (cVar1 == '1') {
      std::bitset<27UL>::flip((bitset<27UL> *)&ais_latitude);
    }
    uVar8 = std::bitset<27UL>::to_ulong((bitset<27UL> *)&ais_latitude);
    auVar11._8_4_ = (int)(uVar8 >> 0x20);
    auVar11._0_8_ = uVar8;
    auVar11._12_4_ = 0x45300000;
    local_11f8 = (((auVar11._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0)) / 10000.0) / 60.0;
    if (cVar1 == '1') {
      local_11f8 = local_11f8 * -1.0;
    }
    std::__cxx11::string::substr((ulong)local_1218,(ulong)&x);
    std::__cxx11::string::operator=((string *)local_fd0,local_1218);
    std::__cxx11::string::~string(local_1218);
    std::__cxx11::string::string((string *)&local_1240,(string *)local_fd0);
    iVar4 = bin_to_int_AIS(&local_1240);
    std::__cxx11::string::~string((string *)&local_1240);
    local_121c = iVar4 / 10;
    std::__cxx11::string::substr((ulong)local_1260,(ulong)&x);
    std::__cxx11::string::operator=((string *)local_fd0,local_1260);
    std::__cxx11::string::~string(local_1260);
    std::__cxx11::string::string((string *)&local_1288,(string *)local_fd0);
    iVar4 = bin_to_int_AIS(&local_1288);
    std::__cxx11::string::~string((string *)&local_1288);
    local_1264 = iVar4;
    poVar9 = std::operator<<((ostream *)&std::cout,"\nmessage type = \t\t");
    std::ostream::operator<<(poVar9,local_fd4);
    poVar9 = std::operator<<((ostream *)&std::cout,"\nrepeat indicator = \t");
    std::ostream::operator<<(poVar9,local_1024);
    _Var2 = std::setfill<char>('0');
    poVar9 = std::operator<<(&std::cout,_Var2._M_c);
    poVar9 = std::operator<<(poVar9,"\nMMSI = \t\t\t");
    _Var5 = std::setw(9);
    poVar9 = std::operator<<(poVar9,_Var5);
    std::ostream::operator<<(poVar9,local_106c);
    poVar9 = std::operator<<((ostream *)&std::cout,"\nnavagation status = \t");
    std::ostream::operator<<(poVar9,local_10b4);
    poVar9 = std::operator<<((ostream *)&std::cout,"\nrate of turn = \t\t");
    std::ostream::operator<<(poVar9,local_10fc);
    poVar9 = std::operator<<((ostream *)&std::cout,"\nspeed over ground = \t");
    std::ostream::operator<<(poVar9,iVar3 / 10);
    poVar9 = std::operator<<((ostream *)&std::cout,"\nposition accuracy = \t");
    std::operator<<(poVar9,local_1188);
    poVar9 = (ostream *)std::ostream::operator<<(&std::cout,std::fixed);
    poVar9 = std::operator<<(poVar9,"\nlongitude = \t\t");
    std::ostream::operator<<(poVar9,dStack_11c0);
    poVar9 = (ostream *)std::ostream::operator<<(&std::cout,std::fixed);
    poVar9 = std::operator<<(poVar9,"\nlatitude = \t\t");
    std::ostream::operator<<(poVar9,local_11f8);
    poVar9 = std::operator<<((ostream *)&std::cout,"\ncourse over ground = \t");
    std::ostream::operator<<(poVar9,local_121c);
    poVar9 = std::operator<<((ostream *)&std::cout,"\ntrue heading = \t\t");
    std::ostream::operator<<(poVar9,local_1264);
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    *pAIS_Latitude = local_11f8;
    *pAIS_Longitude = dStack_11c0;
    *pAIS_SOG = (double)(iVar3 / 10) / 1.94;
    *pAIS_COG = ((double)local_121c * 3.141592653589793) / 180.0;
    aisbuf_local._4_4_ = 0;
    local_ffc = 1;
    std::__cxx11::string::~string(local_1188);
  }
  std::__cxx11::string::~string((string *)local_fd0);
  std::__cxx11::string::~string((string *)&x);
  std::__cxx11::string::~string(local_f78);
  local_1450 = (string *)(six_bit_table[0x77].field_2._M_local_buf + 8);
  do {
    local_1450 = local_1450 + -0x20;
    std::__cxx11::string::~string(local_1450);
  } while (local_1450 != local_f48);
  return aisbuf_local._4_4_;
}

Assistant:

inline int decode_AIS(char* aisbuf, int aisbuflen, double* pAIS_Latitude, double* pAIS_Longitude, double* pAIS_SOG, double* pAIS_COG)
{	
	UNREFERENCED_PARAMETER(aisbuflen);

	// six bit ascii table. (gpsd.berlios.de/AIVDM)
	std::string six_bit_table[120];
	six_bit_table[48]="000000";
	six_bit_table[49]="000001";
	six_bit_table[50]="000010";
	six_bit_table[51]="000011";
	six_bit_table[52]="000100";
	six_bit_table[53]="000101";
	six_bit_table[54]="000110";
	six_bit_table[55]="000111";
	six_bit_table[56]="001000";
	six_bit_table[57]="001001";
	six_bit_table[58]="001010";
	six_bit_table[59]="001011";
	six_bit_table[60]="001100";
	six_bit_table[61]="001101";
	six_bit_table[62]="001110";
	six_bit_table[63]="001111";
	six_bit_table[64]="010000";
	six_bit_table[65]="010001";
	six_bit_table[66]="010010";
	six_bit_table[67]="010011";
	six_bit_table[68]="010100";
	six_bit_table[69]="010101";
	six_bit_table[70]="010110";
	six_bit_table[71]="010111";
	six_bit_table[72]="011000";
	six_bit_table[73]="011001";
	six_bit_table[74]="011010";
	six_bit_table[75]="011011";
	six_bit_table[76]="011100";
	six_bit_table[77]="011101";
	six_bit_table[78]="011110";
	six_bit_table[79]="011111";
	six_bit_table[80]="100000";
	six_bit_table[81]="100001";
	six_bit_table[82]="100010";
	six_bit_table[83]="100011";
	six_bit_table[84]="100100";
	six_bit_table[85]="100101";
	six_bit_table[86]="100110";
	six_bit_table[87]="100111";

	six_bit_table[96]="101000";
	six_bit_table[97]="101001";
	six_bit_table[98]="101010";
	six_bit_table[99]="101011";
	six_bit_table[100]="101100";
	six_bit_table[101]="101101";
	six_bit_table[102]="101110";
	six_bit_table[103]="101111";
	six_bit_table[104]="110000";
	six_bit_table[105]="110001";
	six_bit_table[106]="110010";
	six_bit_table[107]="110011";
	six_bit_table[108]="110100";
	six_bit_table[109]="110101";
	six_bit_table[110]="110110";
	six_bit_table[111]="110111";
	six_bit_table[112]="111000";
	six_bit_table[113]="111001";
	six_bit_table[114]="111010";
	six_bit_table[115]="111011";
	six_bit_table[116]="111100";
	six_bit_table[117]="111101";
	six_bit_table[118]="111110";
	six_bit_table[119]="111111";



	std::string six_bit=aisbuf;

	// convert 6 bit string to binary
	std::string ais_binary="";
	unsigned int x = 0;
	for (x=0; x<six_bit.length(); x++) {
		int z,y;
		z=six_bit[x];
		y=(x+1)*6-5;
		ais_binary.append(six_bit_table[z]);
		//std::cout<<z<<" "<<six_bit_table[z]<<" "<<y<<std::endl;
	}

	std::string temp_s=ais_binary.substr(0,6);
	//std::bitset<6> bb (temp_s);
	//int ais_message_type=bb.to_ulong();
	int ais_message_type=bin_to_int_AIS(temp_s);

	if ((ais_message_type < 1)||(ais_message_type > 3))
	{
		// Unhandled...
		return EXIT_FAILURE;
	}

	temp_s=ais_binary.substr(6,2);
	//std::bitset<2> cc (temp_s);
	//int ais_repeat_indicator=cc.to_ulong();
	int ais_repeat_indicator=bin_to_int_AIS(temp_s);

	temp_s=ais_binary.substr(8,30);
	//std::bitset<30> dd (temp_s);
	//int ais_mmsi=dd.to_ulong();
	int ais_mmsi=bin_to_int_AIS(temp_s);

	temp_s=ais_binary.substr(38,4);
	//std::bitset<4> ee(temp_s);
	//int ais_navigation_status=ee.to_ulong();
	int ais_navigation_status=bin_to_int_AIS(temp_s);

	temp_s=ais_binary.substr(42,8);
	//std::bitset<8> ff(temp_s);
	//int ais_rate_of_turn=ff.to_ulong();
	int ais_rate_of_turn=bin_to_int_AIS(temp_s);

	temp_s=ais_binary.substr(50,10);
	//std::bitset<10> gg(temp_s);
	//int ais_speed_over_ground=gg.to_ulong()/10;
	int ais_speed_over_ground=bin_to_int_AIS(temp_s)/10;

	std::string ais_position_accuracy=ais_binary.substr(60,1);

	char west=ais_binary[61];
	temp_s=ais_binary.substr(61,28);
	std::bitset<28> hh(temp_s);
	if (west=='1') {hh.flip();}
	double ais_longitude=hh.to_ulong();
	ais_longitude=ais_longitude/10000/60;
	if (west=='1') {ais_longitude *= -1;}


	char south=ais_binary[89];
	temp_s=ais_binary.substr(89,27);
	std::bitset<27> ii(temp_s);
	if (south=='1') {ii.flip();}
	double ais_latitude=ii.to_ulong();
	ais_latitude=ais_latitude/10000/60;
	if (south=='1') {ais_latitude *= -1;}


	temp_s=ais_binary.substr(116,12);
	//std::bitset<12> jj(temp_s);
	//int ais_course_over_ground=jj.to_ulong()/10;
	int ais_course_over_ground=bin_to_int_AIS(temp_s)/10;


	temp_s=ais_binary.substr(128,9);
	//std::bitset<9> kk(temp_s);
	//int ais_true_heading=kk.to_ulong();
	int ais_true_heading=bin_to_int_AIS(temp_s);

	std::cout<<"\nmessage type = \t\t"<<ais_message_type;
	std::cout<<"\nrepeat indicator = \t"<<ais_repeat_indicator;
	std::cout<< std::setfill('0')<< "\nMMSI = \t\t\t" << std::setw(9) <<ais_mmsi;
	std::cout<<"\nnavagation status = \t"<<ais_navigation_status;
	std::cout<<"\nrate of turn = \t\t"<<ais_rate_of_turn;
	std::cout<<"\nspeed over ground = \t"<<ais_speed_over_ground;
	std::cout<<"\nposition accuracy = \t"<<ais_position_accuracy;
	std::cout<< std::fixed << "\nlongitude = \t\t"<<ais_longitude;
	std::cout<< std::fixed << "\nlatitude = \t\t"<<ais_latitude;
	std::cout<<"\ncourse over ground = \t"<<ais_course_over_ground;
	std::cout<<"\ntrue heading = \t\t"<<ais_true_heading;
	std::cout<<std::endl;

	*pAIS_Latitude = ais_latitude;
	*pAIS_Longitude = ais_longitude;
	*pAIS_SOG = ais_speed_over_ground/1.94; // Convert to speed in m/s.
	*pAIS_COG = ais_course_over_ground*M_PI/180.0; // Convert to angle in rad.

	return EXIT_SUCCESS;
}